

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::UpdateStats
               (BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *state,
               idx_t count)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this;
  atomic<unsigned_long> *paVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  pointer pCVar5;
  ulong *puVar6;
  ulong *puVar7;
  undefined8 *puVar8;
  ulong local_38;
  long lStack_30;
  
  this = &state->current_segment;
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this);
  LOCK();
  paVar1 = &(pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
  UNLOCK();
  if ((state->state).all_invalid == false) {
    pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    local_38 = (state->state).maximum.lower;
    lStack_30 = (state->state).maximum.upper;
    puVar8 = (undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 0x18);
    lVar2 = *(long *)((long)&(pCVar5->stats).statistics.stats_union + 0x20);
    puVar6 = puVar8;
    if (lVar2 == lStack_30) {
      puVar6 = &local_38;
    }
    if (local_38 <= *(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 0x18)) {
      puVar6 = puVar8;
    }
    lVar3 = *(long *)((long)&(pCVar5->stats).statistics.stats_union + 0x10);
    if (lVar2 < lStack_30) {
      puVar6 = &local_38;
    }
    puVar8 = (undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 8);
    puVar7 = puVar8;
    if (lVar3 == lStack_30) {
      puVar7 = &local_38;
    }
    if (*(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 8) <= local_38) {
      puVar7 = puVar8;
    }
    if (lStack_30 < lVar3) {
      puVar7 = &local_38;
    }
    uVar4 = puVar7[1];
    *(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 8) = *puVar7;
    *(undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 0x10) = uVar4;
    uVar4 = puVar6[1];
    *(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 0x18) = *puVar6;
    *(undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 0x20) = uVar4;
    pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this);
    local_38 = (state->state).minimum.lower;
    lStack_30 = (state->state).minimum.upper;
    puVar8 = (undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 0x18);
    lVar2 = *(long *)((long)&(pCVar5->stats).statistics.stats_union + 0x20);
    puVar6 = puVar8;
    if (lVar2 == lStack_30) {
      puVar6 = &local_38;
    }
    if (local_38 <= *(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 0x18)) {
      puVar6 = puVar8;
    }
    if (lVar2 < lStack_30) {
      puVar6 = &local_38;
    }
    lVar2 = *(long *)((long)&(pCVar5->stats).statistics.stats_union + 0x10);
    puVar8 = (undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 8);
    puVar7 = puVar8;
    if (lVar2 == lStack_30) {
      puVar7 = &local_38;
    }
    if (*(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 8) <= local_38) {
      puVar7 = puVar8;
    }
    if (lStack_30 < lVar2) {
      puVar7 = &local_38;
    }
    uVar4 = puVar7[1];
    *(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 8) = *puVar7;
    *(undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 0x10) = uVar4;
    uVar4 = puVar6[1];
    *(ulong *)((long)&(pCVar5->stats).statistics.stats_union + 0x18) = *puVar6;
    *(undefined8 *)((long)&(pCVar5->stats).statistics.stats_union + 0x20) = uVar4;
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}